

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

WhereTerm * whereScanNext(WhereScan *pScan)

{
  short sVar1;
  int iTab;
  Parse *pParse;
  uint uVar7;
  byte bVar2;
  int iVar3;
  Expr *pEVar4;
  CollSeq *pCVar5;
  ulong uVar6;
  ulong uVar8;
  WhereClause *pWVar9;
  WhereTerm *pWVar10;
  int iVar11;
  
  iVar11 = pScan->k;
  pWVar9 = pScan->pWC;
  bVar2 = pScan->iEquiv;
  do {
    sVar1 = pScan->aiColumn[(ulong)bVar2 - 1];
    iTab = pScan->aiCur[(ulong)bVar2 - 1];
    do {
      pWVar10 = pWVar9->a + iVar11;
      for (; iVar11 < pWVar9->nTerm; iVar11 = iVar11 + 1) {
        if ((((pWVar10->leftCursor == iTab) && ((pWVar10->u).leftColumn == (int)sVar1)) &&
            ((sVar1 != -2 ||
             (iVar3 = sqlite3ExprCompareSkip(pWVar10->pExpr->pLeft,pScan->pIdxExpr,iTab), iVar3 == 0
             )))) && ((pScan->iEquiv < 2 || ((pWVar10->pExpr->flags & 1) == 0)))) {
          uVar7._0_2_ = pWVar10->eOperator;
          uVar7._2_1_ = pWVar10->nChild;
          uVar7._3_1_ = pWVar10->eMatchOp;
          if ((uVar7 >> 0xb & 1) != 0) {
            bVar2 = pScan->nEquiv;
            uVar8 = (ulong)bVar2;
            if ((uVar8 < 0xb) &&
               (pEVar4 = sqlite3ExprSkipCollate(pWVar10->pExpr->pRight), pEVar4->op == 0x9e)) {
              for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
                if ((pScan->aiCur[uVar6] == pEVar4->iTable) &&
                   (pScan->aiColumn[uVar6] == pEVar4->iColumn)) {
                  if (uVar8 != uVar6) goto LAB_001717e9;
                  break;
                }
              }
              pScan->aiCur[uVar8] = pEVar4->iTable;
              pScan->aiColumn[uVar8] = pEVar4->iColumn;
              pScan->nEquiv = bVar2 + 1;
              uVar7 = (uint)pWVar10->eOperator;
            }
          }
LAB_001717e9:
          if ((pScan->opMask & uVar7 & 0xffff) != 0) {
            if ((((uVar7 & 0xffff) >> 8 & 1) == 0) && (pScan->zCollName != (char *)0x0)) {
              pParse = pWVar9->pWInfo->pParse;
              pEVar4 = pWVar10->pExpr;
              iVar3 = sqlite3IndexAffinityOk(pEVar4,pScan->idxaff);
              if (iVar3 != 0) {
                pCVar5 = sqlite3BinaryCompareCollSeq(pParse,pEVar4->pLeft,pEVar4->pRight);
                if (pCVar5 == (CollSeq *)0x0) {
                  pCVar5 = pParse->db->pDfltColl;
                }
                iVar3 = sqlite3StrICmp(pCVar5->zName,pScan->zCollName);
                if (iVar3 == 0) {
                  uVar7 = (uint)pWVar10->eOperator;
                  goto LAB_00171862;
                }
              }
            }
            else {
LAB_00171862:
              if (((((uVar7 & 0x82) == 0) || (pEVar4 = pWVar10->pExpr->pRight, pEVar4->op != 0x9e))
                  || (pEVar4->iTable != pScan->aiCur[0])) || (pEVar4->iColumn != pScan->aiColumn[0])
                 ) {
                pScan->pWC = pWVar9;
                pScan->k = iVar11 + 1;
                return pWVar10;
              }
            }
          }
        }
        pWVar10 = pWVar10 + 1;
      }
      pWVar9 = pWVar9->pOuter;
      iVar11 = 0;
    } while (pWVar9 != (WhereClause *)0x0);
    if (pScan->nEquiv <= pScan->iEquiv) {
      return (WhereTerm *)0x0;
    }
    pWVar9 = pScan->pOrigWC;
    bVar2 = pScan->iEquiv + 1;
    pScan->iEquiv = bVar2;
    iVar11 = 0;
  } while( true );
}

Assistant:

static WhereTerm *whereScanNext(WhereScan *pScan){
  int iCur;            /* The cursor on the LHS of the term */
  i16 iColumn;         /* The column on the LHS of the term.  -1 for IPK */
  Expr *pX;            /* An expression being tested */
  WhereClause *pWC;    /* Shorthand for pScan->pWC */
  WhereTerm *pTerm;    /* The term being tested */
  int k = pScan->k;    /* Where to start scanning */

  assert( pScan->iEquiv<=pScan->nEquiv );
  pWC = pScan->pWC;
  while(1){
    iColumn = pScan->aiColumn[pScan->iEquiv-1];
    iCur = pScan->aiCur[pScan->iEquiv-1];
    assert( pWC!=0 );
    do{
      for(pTerm=pWC->a+k; k<pWC->nTerm; k++, pTerm++){
        if( pTerm->leftCursor==iCur
         && pTerm->u.leftColumn==iColumn
         && (iColumn!=XN_EXPR
             || sqlite3ExprCompareSkip(pTerm->pExpr->pLeft,
                                       pScan->pIdxExpr,iCur)==0)
         && (pScan->iEquiv<=1 || !ExprHasProperty(pTerm->pExpr, EP_FromJoin))
        ){
          if( (pTerm->eOperator & WO_EQUIV)!=0
           && pScan->nEquiv<ArraySize(pScan->aiCur)
           && (pX = sqlite3ExprSkipCollate(pTerm->pExpr->pRight))->op==TK_COLUMN
          ){
            int j;
            for(j=0; j<pScan->nEquiv; j++){
              if( pScan->aiCur[j]==pX->iTable
               && pScan->aiColumn[j]==pX->iColumn ){
                  break;
              }
            }
            if( j==pScan->nEquiv ){
              pScan->aiCur[j] = pX->iTable;
              pScan->aiColumn[j] = pX->iColumn;
              pScan->nEquiv++;
            }
          }
          if( (pTerm->eOperator & pScan->opMask)!=0 ){
            /* Verify the affinity and collating sequence match */
            if( pScan->zCollName && (pTerm->eOperator & WO_ISNULL)==0 ){
              CollSeq *pColl;
              Parse *pParse = pWC->pWInfo->pParse;
              pX = pTerm->pExpr;
              if( !sqlite3IndexAffinityOk(pX, pScan->idxaff) ){
                continue;
              }
              assert(pX->pLeft);
              pColl = sqlite3BinaryCompareCollSeq(pParse,
                                                  pX->pLeft, pX->pRight);
              if( pColl==0 ) pColl = pParse->db->pDfltColl;
              if( sqlite3StrICmp(pColl->zName, pScan->zCollName) ){
                continue;
              }
            }
            if( (pTerm->eOperator & (WO_EQ|WO_IS))!=0
             && (pX = pTerm->pExpr->pRight)->op==TK_COLUMN
             && pX->iTable==pScan->aiCur[0]
             && pX->iColumn==pScan->aiColumn[0]
            ){
              testcase( pTerm->eOperator & WO_IS );
              continue;
            }
            pScan->pWC = pWC;
            pScan->k = k+1;
            return pTerm;
          }
        }
      }
      pWC = pWC->pOuter;
      k = 0;
    }while( pWC!=0 );
    if( pScan->iEquiv>=pScan->nEquiv ) break;
    pWC = pScan->pOrigWC;
    k = 0;
    pScan->iEquiv++;
  }
  return 0;
}